

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_sse.c
# Opt level: O3

parasail_profile_t *
parasail_profile_create_stats_sse_128_32(char *s1,int _s1Len,parasail_matrix_t *matrix)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  void *pvVar4;
  void *pvVar5;
  void *pvVar6;
  parasail_profile_t *ppVar7;
  ulong uVar8;
  long lVar9;
  size_t size;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  ulong uVar16;
  uint uVar17;
  int iVar18;
  __m128i_32_t s;
  __m128i_32_t m;
  __m128i_32_t p;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  if (matrix == (parasail_matrix_t *)0x0) {
    parasail_profile_create_stats_sse_128_32_cold_2();
  }
  else if (s1 == (char *)0x0) {
    parasail_profile_create_stats_sse_128_32_cold_1();
  }
  else {
    if (matrix->type != 0) {
      _s1Len = matrix->length;
    }
    uVar1 = matrix->size;
    iVar14 = _s1Len + 6;
    if (-1 < _s1Len + 3) {
      iVar14 = _s1Len + 3;
    }
    uVar17 = iVar14 >> 2;
    size = (long)(int)(uVar17 * uVar1) << 4;
    pvVar4 = parasail_memalign(0x10,size);
    if ((((pvVar4 != (void *)0x0) && (pvVar5 = parasail_memalign(0x10,size), pvVar5 != (void *)0x0))
        && (pvVar6 = parasail_memalign(0x10,size), pvVar6 != (void *)0x0)) &&
       (ppVar7 = parasail_profile_new(s1,_s1Len,matrix), ppVar7 != (parasail_profile_t *)0x0)) {
      if (0 < (int)uVar1) {
        uVar8 = 1;
        if (1 < (int)uVar17) {
          uVar8 = (ulong)uVar17;
        }
        uVar11 = 0;
        lVar12 = 0;
        do {
          if (0 < _s1Len) {
            lVar12 = (long)(int)lVar12;
            iVar14 = 0;
            uVar10 = 0;
            do {
              iVar2 = matrix->type;
              lVar9 = 0;
              uVar16 = uVar10;
              iVar18 = iVar14;
              do {
                iVar15 = (int)uVar16;
                if (iVar2 == 0) {
                  if (iVar15 < _s1Len) {
                    iVar3 = matrix->mapper[(byte)s1[uVar16]] + (int)uVar11 * uVar1;
                    goto LAB_005aaee8;
                  }
LAB_005aaef4:
                  iVar3 = 0;
                }
                else {
                  if (_s1Len <= iVar15) goto LAB_005aaef4;
                  iVar3 = matrix->mapper[(byte)matrix->alphabet[uVar11]] + iVar18;
LAB_005aaee8:
                  iVar3 = matrix->matrix[iVar3];
                }
                *(int *)((long)&local_48 + lVar9 * 4) = iVar3;
                uVar13 = 0;
                if (iVar15 < _s1Len) {
                  uVar13 = (uint)(uVar11 == (uint)matrix->mapper[(byte)s1[uVar16]]);
                }
                *(uint *)((long)&local_58 + lVar9 * 4) = uVar13;
                *(uint *)((long)&local_68 + lVar9 * 4) = (uint)(0 < iVar3);
                uVar16 = uVar16 + uVar17;
                lVar9 = lVar9 + 1;
                iVar18 = iVar18 + uVar17 * uVar1;
              } while (lVar9 != 4);
              lVar9 = lVar12 * 0x10;
              *(undefined8 *)((long)pvVar4 + lVar9) = local_48;
              ((undefined8 *)((long)pvVar4 + lVar9))[1] = uStack_40;
              *(undefined8 *)((long)pvVar5 + lVar9) = local_58;
              ((undefined8 *)((long)pvVar5 + lVar9))[1] = uStack_50;
              *(undefined8 *)((long)pvVar6 + lVar9) = local_68;
              ((undefined8 *)((long)pvVar6 + lVar9))[1] = uStack_60;
              lVar12 = lVar12 + 1;
              uVar10 = uVar10 + 1;
              iVar14 = iVar14 + uVar1;
            } while (uVar10 != uVar8);
          }
          uVar11 = uVar11 + 1;
        } while (uVar11 != uVar1);
      }
      (ppVar7->profile32).score = pvVar4;
      (ppVar7->profile32).matches = pvVar5;
      (ppVar7->profile32).similar = pvVar6;
      ppVar7->free = parasail_free___m128i;
      return ppVar7;
    }
  }
  return (parasail_profile_t *)0x0;
}

Assistant:

parasail_profile_t * parasail_profile_create_stats_sse_128_32(
        const char * const restrict s1, const int _s1Len,
        const parasail_matrix_t *matrix)
{
    int s1Len = 0;
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t segNum = 0;
    int32_t n = 0;
    const int32_t segWidth = 4; /* number of values in vector unit */
    int32_t segLen = 0;
    __m128i* restrict vProfile = NULL;
    __m128i* restrict vProfileM = NULL;
    __m128i* restrict vProfileS = NULL;
    int32_t index = 0;
    parasail_profile_t *profile = NULL;

    PARASAIL_CHECK_NULL(matrix);
    /* s1 is required for both pssm and square */
    PARASAIL_CHECK_NULL(s1);

    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    n = matrix->size; /* number of amino acids in table */
    segLen = (s1Len + segWidth - 1) / segWidth;
    vProfile = parasail_memalign___m128i(16, n * segLen);
    if (!vProfile) return NULL;
    vProfileM = parasail_memalign___m128i(16, n * segLen);
    if (!vProfileM) return NULL;
    vProfileS = parasail_memalign___m128i(16, n * segLen);
    if (!vProfileS) return NULL;
    profile = parasail_profile_new(s1, s1Len, matrix);
    if (!profile) return NULL;

    for (k=0; k<n; ++k) {
        for (i=0; i<segLen; ++i) {
            __m128i_32_t p;
            __m128i_32_t m;
            __m128i_32_t s;
            j = i;
            for (segNum=0; segNum<segWidth; ++segNum) {
                if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
                    p.v[segNum] = j >= s1Len ? 0 : matrix->matrix[n*k+matrix->mapper[(unsigned char)s1[j]]];
                }
                else {
                    p.v[segNum] = j >= s1Len ? 0 : matrix->matrix[n*j+matrix->mapper[(unsigned char)matrix->alphabet[k]]];
                }
                m.v[segNum] = j >= s1Len ? 0 : (k == matrix->mapper[(unsigned char)s1[j]]);
                s.v[segNum] = p.v[segNum] > 0;
                j += segLen;
            }
            _mm_store_si128(&vProfile[index], p.m);
            _mm_store_si128(&vProfileM[index], m.m);
            _mm_store_si128(&vProfileS[index], s.m);
            ++index;
        }
    }

    profile->profile32.score = vProfile;
    profile->profile32.matches = vProfileM;
    profile->profile32.similar = vProfileS;
    profile->free = &parasail_free___m128i;
    return profile;
}